

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::addDependency
          (CommonCore *this,LocalFederateId federateID,string_view federateName)

{
  FederateState *pFVar1;
  InvalidIdentifier *this_00;
  size_t size;
  string_view message;
  ActionMessage search;
  ActionMessage local_e0;
  
  size = federateName._M_len;
  pFVar1 = getFederateAt(this,federateID);
  if (pFVar1 == (FederateState *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid (addDependency)";
    message._M_len = 0x24;
    InvalidIdentifier::InvalidIdentifier(this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  ActionMessage::ActionMessage(&local_e0,cmd_search_dependency);
  local_e0.source_id.gid = (pFVar1->global_id)._M_i.gid;
  local_e0.payload.bufferSize = size;
  if ((local_e0.payload.heap != (byte *)federateName._M_str) &&
     (SmallBuffer::reserve(&local_e0.payload,size), size != 0)) {
    memcpy(local_e0.payload.heap,federateName._M_str,size);
  }
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e0);
  ActionMessage::~ActionMessage(&local_e0);
  return;
}

Assistant:

void CommonCore::addDependency(LocalFederateId federateID, std::string_view federateName)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (addDependency)"));
    }
    ActionMessage search(CMD_SEARCH_DEPENDENCY);
    search.source_id = fed->global_id.load();
    search.name(federateName);
    addActionMessage(std::move(search));
}